

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

PVIPNode *
PVIP_node_new_intf(PVIPParserContext *parser,PVIP_node_type_t type,char *str,size_t len,int base)

{
  char *__nptr;
  char *pcVar1;
  longlong n;
  PVIPNode *pPVar2;
  size_t sVar3;
  
  __nptr = (char *)malloc(len + 1);
  pcVar1 = __nptr;
  if (len != 0) {
    sVar3 = 0;
    do {
      if (str[sVar3] != '_') {
        *pcVar1 = str[sVar3];
        pcVar1 = pcVar1 + 1;
      }
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  *pcVar1 = '\0';
  n = strtoll(__nptr,(char **)0x0,base);
  free(__nptr);
  pPVar2 = PVIP_node_new_int(parser,type,n);
  return pPVar2;
}

Assistant:

PVIPNode * PVIP_node_new_intf(PVIPParserContext* parser, PVIP_node_type_t type, const char *str, size_t len, int base) {
    char * buf = malloc(len+1);
    char *bufp = buf;
    int i;
    for (i=0; i<len; i++) {
        if (str[i] != '_') {
            *bufp++ = str[i];
        }
    }
    *bufp++ = '\0';
    int64_t n = strtoll(buf, NULL, base);
    free(buf);
    return PVIP_node_new_int(parser, type, n);
}